

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O1

void __thiscall chrono::ChArchiveAsciiDump::out(ChArchiveAsciiDump *this,ChNameValue<float> *bVal)

{
  ChStreamOutAscii *this_00;
  int iVar1;
  
  if (0 < *(int *)&(this->super_ChArchiveOut).field_0x104) {
    iVar1 = 0;
    do {
      ChStreamOutAscii::operator<<(this->ostream,"\t");
      iVar1 = iVar1 + 1;
    } while (iVar1 < *(int *)&(this->super_ChArchiveOut).field_0x104);
  }
  if (this->suppress_names == false) {
    this_00 = ChStreamOutAscii::operator<<(this->ostream,bVal->_name);
    ChStreamOutAscii::operator<<(this_00,"\t");
  }
  ChStreamOutAscii::operator<<(this->ostream,*bVal->_value);
  ChStreamOutAscii::operator<<(this->ostream,"\n");
  return;
}

Assistant:

virtual void out     (ChNameValue<float> bVal){
            indent();
            if (!suppress_names) 
                (*ostream) << bVal.name() << "\t";
            (*ostream) << bVal.value();
            (*ostream) << "\n";
      }